

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CodeSinkingPass::ReferencesMutableMemory(CodeSinkingPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *this_00;
  
  bVar1 = spvOpcodeIsLoad(inst->opcode_);
  if (bVar1) {
    this_00 = Instruction::GetBaseAddress(inst);
    if (this_00->opcode_ != OpVariable) {
      return true;
    }
    bVar1 = Instruction::IsReadOnlyPointer(this_00);
    if (!bVar1) {
      bVar1 = HasUniformMemorySync(this);
      if (bVar1) {
        return true;
      }
      uVar2 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar2 = (uint)this_00->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(this_00,uVar2);
      if (uVar2 != 2) {
        return true;
      }
      bVar1 = HasPossibleStore(this,this_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool CodeSinkingPass::ReferencesMutableMemory(Instruction* inst) {
  if (!inst->IsLoad()) {
    return false;
  }

  Instruction* base_ptr = inst->GetBaseAddress();
  if (base_ptr->opcode() != spv::Op::OpVariable) {
    return true;
  }

  if (base_ptr->IsReadOnlyPointer()) {
    return false;
  }

  if (HasUniformMemorySync()) {
    return true;
  }

  if (spv::StorageClass(base_ptr->GetSingleWordInOperand(0)) !=
      spv::StorageClass::Uniform) {
    return true;
  }

  return HasPossibleStore(base_ptr);
}